

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

void prvTidyDefineMutedMessage(TidyDocImpl *doc,TidyOptionImpl *opt,ctmbstr name)

{
  int iVar1;
  tidyStrings *ptVar2;
  uint uVar3;
  uint uVar4;
  tidyStrings tVar5;
  tidyStringsKeyItem *ptVar6;
  
  iVar1 = strcmp("TidyDiagnostics",name);
  if (iVar1 == 0) {
    ptVar6 = tidyStringsKeys;
  }
  else {
    uVar3 = 1;
    do {
      uVar4 = uVar3;
      if (tidyStringsKeys[uVar4].key == (char *)0x0) {
        tVar5 = 0xffffffff;
        goto LAB_0014f4ed;
      }
      iVar1 = strcmp(tidyStringsKeys[uVar4].key,name);
      uVar3 = uVar4 + 1;
    } while (iVar1 != 0);
    ptVar6 = tidyStringsKeys + uVar4;
  }
  tVar5 = ptVar6->value;
LAB_0014f4ed:
  if (tVar5 - REPORT_MESSAGE_LAST < 0xffffff8e) {
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x277,opt->name,name);
    return;
  }
  if ((doc->muted).list == (tidyStrings *)0x0) {
    ptVar2 = (tidyStrings *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x28);
    (doc->muted).list = ptVar2;
    *ptVar2 = 0;
    (doc->muted).count = 0;
    (doc->muted).capacity = 10;
  }
  uVar3 = (doc->muted).capacity;
  if (uVar3 <= (doc->muted).count) {
    uVar3 = uVar3 * 2;
    (doc->muted).capacity = uVar3;
    ptVar2 = (tidyStrings *)
             (*doc->allocator->vtbl->realloc)(doc->allocator,(doc->muted).list,(ulong)uVar3 * 4 + 1)
    ;
    (doc->muted).list = ptVar2;
  }
  ptVar2 = (doc->muted).list;
  ptVar2[(doc->muted).count] = tVar5;
  uVar3 = (doc->muted).count + 1;
  (doc->muted).count = uVar3;
  ptVar2[uVar3] = 0;
  prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x27a,name);
  return;
}

Assistant:

void TY_(DefineMutedMessage)(TidyDocImpl* doc, const TidyOptionImpl* opt, ctmbstr name)
{
    enum { capacity = 10 };
    TidyMutedMessages *list = &(doc->muted);
    tidyStrings message = TY_(tidyErrorCodeFromKey)( name );

    if ( message <= REPORT_MESSAGE_FIRST || message >= REPORT_MESSAGE_LAST)
    {
        TY_(Report)( doc, NULL, NULL, STRING_ARGUMENT_BAD, opt->name, name );
        return;
    }

    if ( !list->list )
    {
        list->list = TidyAlloc(doc->allocator, sizeof(tidyStrings) * capacity );
        list->list[0] = 0;
        list->capacity = capacity;
        list->count = 0;
    }

    if ( list->count >= list->capacity )
    {
        list->capacity = list->capacity * 2;
        list->list = TidyRealloc(doc->allocator, list->list, sizeof(tidyStrings) * list->capacity + 1 );
    }

    list->list[list->count] = message;
    list->count++;
    list->list[list->count] = 0;

    /* Must come *after* adding to the list, in case it's muted, too. */
    TY_(Report)( doc, NULL, NULL, STRING_MUTING_TYPE, name );
}